

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

int __thiscall KMaxDistance::getNumMaxRecs(KMaxDistance *this,MaxRec *srcRec)

{
  MaxRec *rec;
  int cnt;
  MaxRec *srcRec_local;
  KMaxDistance *this_local;
  
  cnt = 0;
  for (rec = srcRec; rec != (MaxRec *)0x0; rec = (MaxRec *)rec->next) {
    if (rec->isUsed != 0) {
      cnt = cnt + 1;
    }
  }
  return cnt;
}

Assistant:

int KMaxDistance::getNumMaxRecs( MaxRec *srcRec ){
    int cnt = 0;
    MaxRec *rec = srcRec;
    while ( rec != NULL ){
        if ( rec->isUsed ) cnt++;
        rec = (MaxRec*)rec->next;
    }
    return cnt;
}